

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_set_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  REF_DBL RVar10;
  REF_DBL current_complexity;
  REF_NODE local_68;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_48;
  REF_DBL RStack_40;
  
  pRVar4 = ref_grid->node;
  iVar1 = ref_grid->twod;
  local_58 = target_complexity;
  uVar2 = ref_metric_complexity(metric,ref_grid,&current_complexity);
  if (uVar2 == 0) {
    auVar8._0_8_ = current_complexity * 1e+20;
    auVar8._8_8_ = local_58;
    auVar9._8_8_ = -local_58;
    auVar9._0_8_ = -auVar8._0_8_;
    auVar9 = maxpd(auVar8,auVar9);
    if (auVar9._0_8_ <= auVar9._8_8_) {
      uVar2 = 4;
    }
    else {
      local_60 = *(double *)(&DAT_00228b80 + (ulong)(iVar1 == 0) * 8);
      local_48 = 0.0;
      RStack_40 = 1.0;
      pRVar5 = metric;
      RVar10 = local_58;
      local_68 = pRVar4;
      for (lVar3 = 0; lVar3 < pRVar4->max; lVar3 = lVar3 + 1) {
        if (-1 < pRVar4->global[lVar3]) {
          for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
            dVar7 = pow(RVar10 / current_complexity,local_60);
            pRVar5[lVar6] = dVar7 * pRVar5[lVar6];
            RVar10 = local_58;
          }
          pRVar4 = local_68;
          if (ref_grid->twod != 0) {
            metric[lVar3 * 6 + 2] = 0.0;
            metric[lVar3 * 6 + 4] = local_48;
            (metric + lVar3 * 6 + 4)[1] = RStack_40;
          }
        }
        pRVar5 = pRVar5 + 6;
      }
      uVar2 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x7c8,
           "ref_metric_set_complexity",(ulong)uVar2,"cmp");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_set_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(target_complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}